

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hex_float.h
# Opt level: O0

ostream * spvtools::utils::operator<<(ostream *os,FloatProxy<float> *value)

{
  FloatProxy<float> *os_00;
  int iVar1;
  HexFloat<spvtools::utils::FloatProxy<float>,_spvtools::utils::HexFloatTraits<spvtools::utils::FloatProxy<float>_>_>
  local_2c;
  streamsize local_28;
  streamsize saved_precision;
  FloatProxy<float> *pFStack_18;
  float float_val;
  FloatProxy<float> *value_local;
  ostream *os_local;
  
  pFStack_18 = value;
  value_local = (FloatProxy<float> *)os;
  saved_precision._4_4_ = FloatProxy<float>::getAsFloat(value);
  iVar1 = std::fpclassify(saved_precision._4_4_);
  os_00 = value_local;
  if ((iVar1 == 2) || (iVar1 == 4)) {
    local_28 = std::ios_base::precision
                         ((ios_base *)
                          ((long)&value_local->data_ + *(long *)(*(long *)value_local + -0x18)));
    std::ios_base::precision
              ((ios_base *)((long)&value_local->data_ + *(long *)(*(long *)value_local + -0x18)),9);
    std::ostream::operator<<(value_local,saved_precision._4_4_);
    std::ios_base::precision
              ((ios_base *)((long)&value_local->data_ + *(long *)(*(long *)value_local + -0x18)),
               local_28);
  }
  else {
    HexFloat<spvtools::utils::FloatProxy<float>,_spvtools::utils::HexFloatTraits<spvtools::utils::FloatProxy<float>_>_>
    ::HexFloat(&local_2c,(FloatProxy<float>)pFStack_18->data_);
    operator<<((ostream *)os_00,&local_2c);
  }
  return (ostream *)value_local;
}

Assistant:

std::ostream& operator<<(std::ostream& os, const FloatProxy<T>& value) {
  auto float_val = value.getAsFloat();
  switch (std::fpclassify(float_val)) {
    case FP_ZERO:
    case FP_NORMAL: {
      auto saved_precision = os.precision();
      os.precision(std::numeric_limits<T>::max_digits10);
      os << float_val;
      os.precision(saved_precision);
    } break;
    default:
      os << HexFloat<FloatProxy<T>>(value);
      break;
  }
  return os;
}